

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

pool_ptr<soul::heart::Variable> __thiscall
soul::heart::Parser::findVariable(Parser *this,FunctionParseState *state,string *name)

{
  long lVar1;
  bool bVar2;
  reference this_00;
  pool_ref<soul::heart::Variable> *ppVar3;
  Variable *pVVar4;
  Module *pMVar5;
  char *pcVar6;
  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  *this_01;
  reference this_02;
  string *in_RCX;
  string_view sVar7;
  pool_ref<soul::heart::Variable> *blockParameter;
  iterator __end3;
  iterator __begin3;
  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  *__range3;
  pool_ref<soul::heart::Variable> *parameter;
  pool_ref<soul::heart::Variable> *__end2_1;
  pool_ref<soul::heart::Variable> *__begin2_1;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL> *__range2_1;
  pool_ref<soul::heart::Variable> *v;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  *__range2;
  string local_170;
  string local_150;
  undefined1 local_130 [8];
  string variableName;
  string local_100;
  undefined1 local_e0 [8];
  TokenisedPathString path;
  string *name_local;
  FunctionParseState *state_local;
  Parser *this_local;
  pool_ptr<soul::heart::Variable> *stateVariable;
  
  path.sections.space[0xf] = (uint64_t)in_RCX;
  bVar2 = containsChar(in_RCX,':');
  if (bVar2) {
    pcVar6 = (char *)std::__cxx11::string::operator[](path.sections.space[0xf]);
    checkAssertion(*pcVar6 == '$',"name[0] == \'$\'","findVariable",0x461);
    std::__cxx11::string::substr((ulong)&local_100,path.sections.space[0xf]);
    TokenisedPathString::TokenisedPathString((TokenisedPathString *)local_e0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    TokenisedPathString::getLastPart_abi_cxx11_((string *)local_130,(TokenisedPathString *)local_e0)
    ;
    TokenisedPathString::getParentPath_abi_cxx11_(&local_170,(TokenisedPathString *)local_e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                   "$",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130);
    TokenisedPathString::join(&local_150,&local_170,(string *)&__range2);
    Program::findVariableWithName((Program *)this,(string *)&state[1].currentBlock);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&__range2);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)local_130);
    TokenisedPathString::~TokenisedPathString((TokenisedPathString *)local_e0);
  }
  else {
    __end2 = std::
             vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
             ::begin((vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                      *)(name + 1));
    v = (pool_ref<soul::heart::Variable> *)
        std::
        vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
        ::end((vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
               *)(name + 1));
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
                                       *)&v), bVar2) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
                ::operator*(&__end2);
      pVVar4 = pool_ref<soul::heart::Variable>::operator->(this_00);
      sVar7 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)path.sections.space[0xf]);
      bVar2 = Identifier::operator==(&pVVar4->name,sVar7);
      if (bVar2) {
        pool_ref::operator_cast_to_pool_ptr((pool_ref *)this);
        return (pool_ptr<soul::heart::Variable>)(Variable *)this;
      }
      __gnu_cxx::
      __normal_iterator<const_soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
      ::operator++(&__end2);
    }
    lVar1 = *(long *)name;
    __end2_1 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL>::begin
                         ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL> *)
                          (lVar1 + 0x38));
    ppVar3 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL>::end
                       ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL> *)
                        (lVar1 + 0x38));
    for (; __end2_1 != ppVar3; __end2_1 = __end2_1 + 1) {
      pVVar4 = pool_ref<soul::heart::Variable>::operator->(__end2_1);
      sVar7 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)path.sections.space[0xf]);
      bVar2 = Identifier::operator==(&pVVar4->name,sVar7);
      if (bVar2) {
        pool_ref::operator_cast_to_pool_ptr((pool_ref *)this);
        return (pool_ptr<soul::heart::Variable>)(Variable *)this;
      }
    }
    pMVar5 = pool_ptr<soul::Module>::operator->((pool_ptr<soul::Module> *)&state[2].blocks);
    pcVar6 = (char *)std::__cxx11::string::operator_cast_to_basic_string_view
                               ((string *)path.sections.space[0xf]);
    sVar7._M_str = pcVar6;
    sVar7._M_len = (size_t)&pMVar5->stateVariables;
    Module::StateVariables::find((StateVariables *)this,sVar7);
    bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)this);
    if (!bVar2) {
      pool_ptr<soul::heart::Variable>::~pool_ptr((pool_ptr<soul::heart::Variable> *)this);
      if (*(long *)((long)&name[1].field_2 + 8) != 0) {
        this_01 = (vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                   *)(**(long **)((long)&name[1].field_2 + 8) + 0x20);
        __end3 = std::
                 vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                 ::begin(this_01);
        blockParameter =
             (pool_ref<soul::heart::Variable> *)
             std::
             vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
             ::end(this_01);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
                                           *)&blockParameter), bVar2) {
          this_02 = __gnu_cxx::
                    __normal_iterator<soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
                    ::operator*(&__end3);
          pVVar4 = pool_ref<soul::heart::Variable>::operator->(this_02);
          sVar7 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)path.sections.space[0xf]);
          bVar2 = Identifier::operator==(&pVVar4->name,sVar7);
          if (bVar2) {
            pool_ref::operator_cast_to_pool_ptr((pool_ref *)this);
            return (pool_ptr<soul::heart::Variable>)(Variable *)this;
          }
          __gnu_cxx::
          __normal_iterator<soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
          ::operator++(&__end3);
        }
      }
      Program::findVariableWithName((Program *)this,(string *)&state[1].currentBlock);
    }
  }
  return (pool_ptr<soul::heart::Variable>)(Variable *)this;
}

Assistant:

pool_ptr<heart::Variable> findVariable (const FunctionParseState& state, const std::string& name)
    {
        if (containsChar (name, ':'))
        {
            SOUL_ASSERT (name[0] == '$');
            TokenisedPathString path (name.substr (1));
            auto variableName = path.getLastPart();
            return program.findVariableWithName (TokenisedPathString::join (path.getParentPath(), "$" + variableName));
        }

        for (auto& v : state.variables)
            if (v->name == name)
                return v;

        for (auto& parameter : state.function.parameters)
            if (parameter->name == name)
                return parameter;

        if (auto stateVariable = module->stateVariables.find (name))
            return stateVariable;

        if (state.currentBlock != nullptr)
        {
            for (auto& blockParameter : state.currentBlock->block.parameters)
                if (blockParameter->name == name)
                    return blockParameter;
        }

        return program.findVariableWithName (name);
    }